

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

int __thiscall jaegertracing::net::Socket::open(Socket *this,char *__file,int __oflag,...)

{
  int iVar1;
  ostream *poVar2;
  system_error *this_00;
  int *piVar3;
  error_category *__ecat;
  int __domain;
  string sStack_1b8;
  ostringstream oss;
  
  __domain = (int)__file;
  iVar1 = socket(__domain,__oflag,0);
  if (-1 < iVar1) {
    this->_handle = iVar1;
    this->_family = __domain;
    this->_type = __oflag;
    return iVar1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Failed to open socket, family=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,__domain);
  poVar2 = std::operator<<(poVar2,", type=");
  std::ostream::operator<<(poVar2,__oflag);
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  std::__cxx11::stringbuf::str();
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_00,iVar1,__ecat,&sStack_1b8);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void open(int family, int type)
    {
        const auto handle = ::socket(family, type, 0);
        if (isHandleInvalid(handle)) {
            std::ostringstream oss;
            oss << "Failed to open socket"
                   ", family="
                << family << ", type=" << type;
            throw std::system_error(errno, std::system_category(), oss.str());
        }
        _handle = handle;
        _family = family;
        _type = type;
    }